

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O3

void __thiscall
poplar::compact_fkhash_nlm<int,_8UL>::append_dummy(compact_fkhash_nlm<int,_8UL> *this)

{
  ulong uVar1;
  uchar local_9;
  
  uVar1 = this->size_;
  this->size_ = uVar1 + 1;
  if ((uVar1 & 7) == 0 && 7 < uVar1) {
    release_buf_(this);
  }
  local_9 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->chunk_buf_,&local_9);
  return;
}

Assistant:

void append_dummy() {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(size_++);
        if (chunk_id != 0 && pos_in_chunk == 0) {
            release_buf_();
        }

        vbyte::append(chunk_buf_, 0);
    }